

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::append
          (xpath_node_set_raw *this,xpath_node *begin_,xpath_node *end_,xpath_allocator *alloc)

{
  size_t old_size;
  ulong new_size;
  long lVar1;
  void *pvVar2;
  void *in_RCX;
  xpath_allocator *in_RDX;
  xpath_allocator *in_RSI;
  long in_RDI;
  xpath_node *data;
  size_t count;
  size_t capacity;
  size_t size_;
  
  if (in_RSI != in_RDX) {
    old_size = *(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8) >> 4;
    new_size = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 8) >> 4;
    lVar1 = (long)in_RDX - (long)in_RSI >> 4;
    if (new_size < old_size + lVar1) {
      pvVar2 = xpath_allocator::reallocate(in_RDX,in_RCX,old_size,new_size);
      if (pvVar2 == (void *)0x0) {
        return;
      }
      *(void **)(in_RDI + 8) = pvVar2;
      *(void **)(in_RDI + 0x10) = (void *)((long)pvVar2 + old_size * 0x10);
      *(size_t *)(in_RDI + 0x18) = (long)pvVar2 + lVar1 * 0x10 + old_size * 0x10;
    }
    memcpy(*(void **)(in_RDI + 0x10),in_RSI,lVar1 << 4);
    *(long *)(in_RDI + 0x10) = lVar1 * 0x10 + *(long *)(in_RDI + 0x10);
  }
  return;
}

Assistant:

void append(const xpath_node* begin_, const xpath_node* end_, xpath_allocator* alloc)
		{
			if (begin_ == end_) return;

			size_t size_ = static_cast<size_t>(_end - _begin);
			size_t capacity = static_cast<size_t>(_eos - _begin);
			size_t count = static_cast<size_t>(end_ - begin_);

			if (size_ + count > capacity)
			{
				// reallocate the old array or allocate a new one
				xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), (size_ + count) * sizeof(xpath_node)));
				if (!data) return;

				// finalize
				_begin = data;
				_end = data + size_;
				_eos = data + size_ + count;
			}

			memcpy(_end, begin_, count * sizeof(xpath_node));
			_end += count;
		}